

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

void emit_sof(j_compress_ptr cinfo,JPEG_MARKER code)

{
  int iVar1;
  jpeg_component_info *pjVar2;
  
  emit_marker(cinfo,code);
  emit_2bytes(cinfo,cinfo->num_components * 3 + 8);
  if ((0xffff < cinfo->image_height) || (0xffff < cinfo->image_width)) {
    *(undefined8 *)&cinfo->err->msg_code = 0xffff00000029;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  emit_byte(cinfo,cinfo->data_precision);
  emit_2bytes(cinfo,cinfo->image_height);
  emit_2bytes(cinfo,cinfo->image_width);
  emit_byte(cinfo,cinfo->num_components);
  pjVar2 = cinfo->comp_info;
  for (iVar1 = 0; iVar1 < cinfo->num_components; iVar1 = iVar1 + 1) {
    emit_byte(cinfo,pjVar2->component_id);
    emit_byte(cinfo,pjVar2->h_samp_factor * 0x10 + pjVar2->v_samp_factor);
    emit_byte(cinfo,pjVar2->quant_tbl_no);
    pjVar2 = pjVar2 + 1;
  }
  return;
}

Assistant:

LOCAL(void)
emit_sof(j_compress_ptr cinfo, JPEG_MARKER code)
/* Emit a SOF marker */
{
  int ci;
  jpeg_component_info *compptr;

  emit_marker(cinfo, code);

  emit_2bytes(cinfo, 3 * cinfo->num_components + 2 + 5 + 1); /* length */

  /* Make sure image isn't bigger than SOF field can handle */
  if ((long)cinfo->_jpeg_height > 65535L || (long)cinfo->_jpeg_width > 65535L)
    ERREXIT1(cinfo, JERR_IMAGE_TOO_BIG, (unsigned int)65535);

  emit_byte(cinfo, cinfo->data_precision);
  emit_2bytes(cinfo, (int)cinfo->_jpeg_height);
  emit_2bytes(cinfo, (int)cinfo->_jpeg_width);

  emit_byte(cinfo, cinfo->num_components);

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    emit_byte(cinfo, compptr->component_id);
    emit_byte(cinfo, (compptr->h_samp_factor << 4) + compptr->v_samp_factor);
    emit_byte(cinfo, compptr->quant_tbl_no);
  }
}